

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

_Bool ggml_can_repeat(ggml_tensor *t0,ggml_tensor *t1)

{
  _Bool _Var1;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  _Bool local_15;
  
  _Var1 = ggml_is_empty(in_RDI);
  if (_Var1) {
    local_15 = ggml_is_empty(in_RSI);
  }
  else {
    local_15 = false;
    if (((in_RSI->ne[0] % in_RDI->ne[0] == 0) &&
        (local_15 = false, in_RSI->ne[1] % in_RDI->ne[1] == 0)) &&
       (local_15 = false, in_RSI->ne[2] % in_RDI->ne[2] == 0)) {
      local_15 = in_RSI->ne[3] % in_RDI->ne[3] == 0;
    }
  }
  return local_15 != false;
}

Assistant:

bool ggml_can_repeat(const struct ggml_tensor * t0, const struct ggml_tensor * t1) {
    static_assert(GGML_MAX_DIMS == 4, "GGML_MAX_DIMS is not 4 - update this function");

    return ggml_is_empty(t0) ? ggml_is_empty(t1) :
        (t1->ne[0]%t0->ne[0] == 0) &&
        (t1->ne[1]%t0->ne[1] == 0) &&
        (t1->ne[2]%t0->ne[2] == 0) &&
        (t1->ne[3]%t0->ne[3] == 0);
}